

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O2

bool __thiscall cursespp::LayoutBase::KeyPress(LayoutBase *this,string *key)

{
  char cVar1;
  INavigationKeys *pIVar2;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar4;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pIVar2 = Window::NavigationKeys();
  cVar1 = (**(code **)(*(long *)pIVar2 + 0x20))(pIVar2,key);
  this_00 = &local_38;
  puVar4 = local_40;
  lVar3 = 0x1c8;
  if ((cVar1 == '\0') && (cVar1 = (**(code **)(*(long *)pIVar2 + 0x10))(pIVar2,key), cVar1 == '\0'))
  {
    this_00 = &local_48;
    cVar1 = (**(code **)(*(long *)pIVar2 + 0x28))(pIVar2,key);
    puVar4 = local_50;
    lVar3 = 0x1c0;
    if ((cVar1 == '\0') &&
       (cVar1 = (**(code **)(*(long *)pIVar2 + 0x18))(pIVar2,key), cVar1 == '\0')) {
      return false;
    }
  }
  (**(code **)((long)(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable + lVar3))
            (puVar4,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return true;
}

Assistant:

bool LayoutBase::KeyPress(const std::string& key) {
    auto& keys = NavigationKeys();
    if (keys.Left(key) || keys.Up(key)) {
        this->FocusPrev();
        return true;
    }
    else if (keys.Right(key) || keys.Down(key)) {
        this->FocusNext();
        return true;
    }
    return false;
}